

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O2

ctmbstr prvTidyGetEncodingNameFromTidyId(uint id)

{
  long lVar1;
  long lVar2;
  
  lVar1 = 8;
  do {
    lVar2 = lVar1;
    if ((int)(lVar2 + 0x18) == 0x140) break;
    lVar1 = lVar2 + 0x18;
  } while (*(uint *)((long)customTagsPicks[0xf].inputs + lVar2 + 0x48) != id);
  return *(ctmbstr *)((long)&enc2iana[0].id + lVar2);
}

Assistant:

ctmbstr TY_(GetEncodingNameFromTidyId)(uint id)
{
    uint i;

    for (i = 0; enc2iana[i].name; ++i)
        if (enc2iana[i].id == id)
            return enc2iana[i].name;

    return NULL;
}